

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

char * cimg_library::cimg::filenamerand(void)

{
  int iVar1;
  uint __seed;
  char local_18;
  char local_14;
  uint local_c;
  int v;
  uint k;
  
  __seed = 6;
  mutex(6,1);
  srand(__seed);
  for (local_c = 0; local_c < 8; local_c = local_c + 1) {
    iVar1 = rand();
    if (iVar1 % 3 == 0) {
      iVar1 = rand();
      local_14 = (char)(iVar1 % 10) + '0';
    }
    else {
      if (iVar1 % 3 == 1) {
        iVar1 = rand();
        local_18 = (char)(iVar1 % 0x1a) + 'a';
      }
      else {
        iVar1 = rand();
        local_18 = (char)(iVar1 % 0x1a) + 'A';
      }
      local_14 = local_18;
    }
    filenamerand::randomid[local_c] = local_14;
  }
  mutex(6,0);
  return filenamerand::randomid;
}

Assistant:

inline const char* filenamerand() {
      cimg::mutex(6);
      static char randomid[9] = { 0 };
      cimg::srand();
      for (unsigned int k = 0; k<8; ++k) {
        const int v = (int)std::rand()%3;
        randomid[k] = (char)(v==0?('0' + (std::rand()%10)):(v==1?('a' + (std::rand()%26)):('A' + (std::rand()%26))));
      }
      cimg::mutex(6,0);
      return randomid;
    }